

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::~EigenDecompositionSquare
          (EigenDecompositionSquare<double,_1> *this)

{
  ~EigenDecompositionSquare(this);
  operator_delete(this);
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::~EigenDecompositionSquare() {

	for(int i=0; i<kEigenDecompCount; i++) {
		free(gEMatrices[i]);
		free(gIMatrices[i]);
		free(gEigenValues[i]);
	}
	free(gEMatrices);
	free(gIMatrices);
	free(gEigenValues);
	free(matrixTmp);
}